

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall Generators_Stratified3D_Test::TestBody(Generators_Stratified3D_Test *this)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  char *message;
  char *in_R9;
  int iVar8;
  undefined1 auVar9 [64];
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  undefined1 extraout_var [56];
  undefined4 in_XMM1_Db;
  undefined4 extraout_XMM1_Db;
  undefined4 uVar12;
  undefined4 in_XMM1_Dd;
  undefined4 extraout_XMM1_Dd;
  Point3f PVar13;
  AssertionResult gtest_ar_;
  int count;
  Stratified3DIter __begin1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  AssertHelper local_c0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  uint local_ac;
  string local_a8;
  AssertHelper local_88;
  Stratified3DIter local_80;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  local_ac = 0;
  auVar9 = ZEXT3264(_DAT_00573400);
  local_80._0_32_ = _DAT_00573400;
  local_80.nz = 8;
  do {
    uVar12 = 0;
    auVar11 = ZEXT856(auVar9._8_8_);
    PVar13 = pbrt::detail::Stratified3DIter::operator*(&local_80);
    local_58 = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
    auVar10._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar11;
    uVar7 = local_ac + 0x7f;
    uVar5 = local_ac + 3;
    if (-1 < (int)local_ac) {
      uVar7 = local_ac;
      uVar5 = local_ac;
    }
    local_48 = auVar10._0_16_;
    uVar3 = vcmpps_avx512vl(ZEXT416((uint)((float)((int)local_ac % 4) * 0.25)),local_48,2);
    uVar4 = vcmpps_avx512vl(local_48,ZEXT416((uint)((float)(int)((local_ac + 1) -
                                                                (uVar5 & 0xfffffffc)) * 0.25)),1);
    local_c0.data_._0_1_ = (internal)((byte)uVar3 & (byte)uVar4 & 1);
    local_b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    uStack_54 = in_XMM1_Db;
    uStack_50 = uVar12;
    uStack_4c = in_XMM1_Dd;
    if (local_c0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&local_c0,
                 (AssertionResult *)
                 "u[0] >= Float(ix) / Float(nx) && u[0] < Float(ix + 1) / Float(nx)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x485,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) &&
           (local_c8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_c8.ptr_ + 8))();
        }
        local_c8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar8 = ((int)uVar5 >> 2) % 0x20;
    auVar1 = vmovshdup_avx(local_48);
    uVar3 = vcmpps_avx512vl(ZEXT416((uint)((float)iVar8 * 0.03125)),auVar1,2);
    uVar4 = vcmpps_avx512vl(auVar1,ZEXT416((uint)((float)(iVar8 + 1) * 0.03125)),1);
    local_c0.data_._0_1_ = (internal)((byte)uVar3 & (byte)uVar4 & 1);
    local_b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_c0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&local_c0,
                 (AssertionResult *)
                 "u[1] >= Float(iy) / Float(ny) && u[1] < Float(iy + 1) / Float(ny)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x486,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) &&
           (local_c8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_c8.ptr_ + 8))();
        }
        local_c8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    fVar2 = (float)((int)uVar7 >> 7) * 0.125;
    auVar9 = ZEXT464((uint)fVar2);
    in_XMM1_Db = 0;
    in_XMM1_Dd = 0;
    auVar1._4_4_ = uStack_54;
    auVar1._0_4_ = local_58;
    auVar1._8_4_ = uStack_50;
    auVar1._12_4_ = uStack_4c;
    uVar3 = vcmpps_avx512vl(ZEXT416((uint)fVar2),auVar1,2);
    uVar4 = vcmpps_avx512vl(auVar1,ZEXT416((uint)((float)(((int)uVar7 >> 7) + 1) * 0.125)),1);
    local_c0.data_._0_1_ = (internal)((byte)uVar3 & (byte)uVar4 & 1);
    local_b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_c0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&local_c0,
                 (AssertionResult *)
                 "u[2] >= Float(iz) / Float(nz) && u[2] < Float(iz + 1) / Float(nz)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x487,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) &&
           (local_c8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          auVar9._0_8_ = (**(code **)(*(long *)local_c8.ptr_ + 8))();
          auVar9._8_56_ = extraout_var;
          in_XMM1_Db = extraout_XMM1_Db;
          in_XMM1_Dd = extraout_XMM1_Dd;
        }
        local_c8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_ac = local_ac + 1;
    iVar8 = local_80.super_RNGIterator<pbrt::detail::Stratified3DIter>.
            super_IndexingIterator<pbrt::detail::Stratified3DIter>.i + 1;
    local_80.super_RNGIterator<pbrt::detail::Stratified3DIter>.
    super_IndexingIterator<pbrt::detail::Stratified3DIter>.i = iVar8;
  } while (iVar8 != 0x400);
  local_a8._M_dataplus._M_p._0_4_ = 0x400;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_80,"nx * ny * nz","count",(int *)&local_a8,(int *)&local_ac);
  if (local_80.super_RNGIterator<pbrt::detail::Stratified3DIter>.
      super_IndexingIterator<pbrt::detail::Stratified3DIter>.i._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)local_80.super_RNGIterator<pbrt::detail::Stratified3DIter>.rng.state ==
        (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_80.super_RNGIterator<pbrt::detail::Stratified3DIter>.rng.state;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x48a,message);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((long *)local_a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
      }
      local_a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)((long)&local_80 + 8),
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Generators, Stratified3D) {
    int count = 0, nx = 4, ny = 32, nz = 8;  // power of 2
    for (Point3f u : Stratified3D(nx, ny, nz)) {
        int ix = count % nx;
        int iy = (count / nx) % ny;
        int iz = count / (nx * ny);
        EXPECT_TRUE(u[0] >= Float(ix) / Float(nx) && u[0] < Float(ix + 1) / Float(nx));
        EXPECT_TRUE(u[1] >= Float(iy) / Float(ny) && u[1] < Float(iy + 1) / Float(ny));
        EXPECT_TRUE(u[2] >= Float(iz) / Float(nz) && u[2] < Float(iz + 1) / Float(nz));
        ++count;
    }
    EXPECT_EQ(nx * ny * nz, count);
}